

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ViewGetColumnNames(Parse *pParse,Table *pTable)

{
  i16 *pnCol;
  u16 *puVar1;
  sqlite3 *db;
  Module *pMod;
  sqlite3_xauth p_Var2;
  int iVar3;
  VTable *pVVar4;
  HashElem *pHVar5;
  Select *pSelect;
  Table *pTable_00;
  char *pcVar6;
  char *zFormat;
  char *zModule;
  char *local_38;
  
  db = pParse->db;
  if (pTable->nModuleArg != 0) {
    for (pVVar4 = pTable->pVTable; pVVar4 != (VTable *)0x0; pVVar4 = pVVar4->pNext) {
      if (pVVar4->db == db) {
        return 0;
      }
    }
    pcVar6 = *pTable->azModuleArg;
    pHVar5 = findElementWithHash(&db->aModule,pcVar6,(uint *)0x0);
    pMod = (Module *)pHVar5->data;
    if (pMod == (Module *)0x0) {
      zFormat = "no such module: %s";
      goto LAB_00163fae;
    }
    local_38 = (char *)0x0;
    iVar3 = vtabCallConstructor(db,pTable,pMod,pMod->pModule->xConnect,&local_38);
    pcVar6 = local_38;
    if (iVar3 != 0) {
      sqlite3ErrorMsg(pParse,"%s",local_38);
    }
    if (pcVar6 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar6);
    }
    if (iVar3 != 0) {
      return 1;
    }
    if (pTable->nModuleArg != 0) {
      return 0;
    }
  }
  pnCol = &pTable->nCol;
  if (0 < pTable->nCol) {
    return 0;
  }
  if (-1 < pTable->nCol) {
    pSelect = sqlite3SelectDup(db,pTable->pSelect,0);
    if (pSelect == (Select *)0x0) {
      iVar3 = 1;
    }
    else {
      iVar3 = pParse->nTab;
      sqlite3SrcListAssignCursors(pParse,pSelect->pSrc);
      pTable->nCol = -1;
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      p_Var2 = db->xAuth;
      db->xAuth = (sqlite3_xauth)0x0;
      pTable_00 = sqlite3ResultSetOfSelect(pParse,pSelect);
      db->xAuth = p_Var2;
      pParse->nTab = iVar3;
      if (pTable->pCheck == (ExprList *)0x0) {
        if (pTable_00 == (Table *)0x0) {
          *pnCol = 0;
          iVar3 = 1;
        }
        else {
          pTable->nCol = pTable_00->nCol;
          pTable->aCol = pTable_00->aCol;
          pTable_00->nCol = 0;
          pTable_00->aCol = (Column *)0x0;
          iVar3 = 0;
        }
      }
      else {
        sqlite3ColumnsFromExprList((Parse *)pParse->db,pTable->pCheck,pnCol,&pTable->aCol);
        iVar3 = 0;
        if (((db->mallocFailed == '\0') && (pParse->nErr == 0)) &&
           (pSelect->pEList->nExpr == (int)*pnCol)) {
          sqlite3SelectAddColumnTypeAndCollation(pParse,pTable,pSelect);
        }
      }
      sqlite3DeleteTable(db,pTable_00);
      clearSelect(db,pSelect,1);
      (db->lookaside).bDisable = (db->lookaside).bDisable - 1;
    }
    puVar1 = &pTable->pSchema->schemaFlags;
    *puVar1 = *puVar1 | 2;
    return iVar3;
  }
  pcVar6 = pTable->zName;
  zFormat = "view %s is circularly defined";
LAB_00163fae:
  sqlite3ErrorMsg(pParse,zFormat,pcVar6);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ViewGetColumnNames(Parse *pParse, Table *pTable){
  Table *pSelTab;   /* A fake table from which we get the result set */
  Select *pSel;     /* Copy of the SELECT that implements the view */
  int nErr = 0;     /* Number of errors encountered */
  int n;            /* Temporarily holds the number of cursors assigned */
  sqlite3 *db = pParse->db;  /* Database connection for malloc errors */
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth;       /* Saved xAuth pointer */
#endif

  assert( pTable );

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3VtabCallConnect(pParse, pTable) ){
    return SQLITE_ERROR;
  }
  if( IsVirtual(pTable) ) return 0;
#endif

#ifndef SQLITE_OMIT_VIEW
  /* A positive nCol means the columns names for this view are
  ** already known.
  */
  if( pTable->nCol>0 ) return 0;

  /* A negative nCol is a special marker meaning that we are currently
  ** trying to compute the column names.  If we enter this routine with
  ** a negative nCol, it means two or more views form a loop, like this:
  **
  **     CREATE VIEW one AS SELECT * FROM two;
  **     CREATE VIEW two AS SELECT * FROM one;
  **
  ** Actually, the error above is now caught prior to reaching this point.
  ** But the following test is still important as it does come up
  ** in the following:
  ** 
  **     CREATE TABLE main.ex1(a);
  **     CREATE TEMP VIEW ex1 AS SELECT a FROM ex1;
  **     SELECT * FROM temp.ex1;
  */
  if( pTable->nCol<0 ){
    sqlite3ErrorMsg(pParse, "view %s is circularly defined", pTable->zName);
    return 1;
  }
  assert( pTable->nCol>=0 );

  /* If we get this far, it means we need to compute the table names.
  ** Note that the call to sqlite3ResultSetOfSelect() will expand any
  ** "*" elements in the results set of the view and will assign cursors
  ** to the elements of the FROM clause.  But we do not want these changes
  ** to be permanent.  So the computation is done on a copy of the SELECT
  ** statement that defines the view.
  */
  assert( pTable->pSelect );
  pSel = sqlite3SelectDup(db, pTable->pSelect, 0);
  if( pSel ){
    n = pParse->nTab;
    sqlite3SrcListAssignCursors(pParse, pSel->pSrc);
    pTable->nCol = -1;
    db->lookaside.bDisable++;
#ifndef SQLITE_OMIT_AUTHORIZATION
    xAuth = db->xAuth;
    db->xAuth = 0;
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel);
    db->xAuth = xAuth;
#else
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel);
#endif
    pParse->nTab = n;
    if( pTable->pCheck ){
      /* CREATE VIEW name(arglist) AS ...
      ** The names of the columns in the table are taken from
      ** arglist which is stored in pTable->pCheck.  The pCheck field
      ** normally holds CHECK constraints on an ordinary table, but for
      ** a VIEW it holds the list of column names.
      */
      sqlite3ColumnsFromExprList(pParse, pTable->pCheck, 
                                 &pTable->nCol, &pTable->aCol);
      if( db->mallocFailed==0 
       && pParse->nErr==0
       && pTable->nCol==pSel->pEList->nExpr
      ){
        sqlite3SelectAddColumnTypeAndCollation(pParse, pTable, pSel);
      }
    }else if( pSelTab ){
      /* CREATE VIEW name AS...  without an argument list.  Construct
      ** the column names from the SELECT statement that defines the view.
      */
      assert( pTable->aCol==0 );
      pTable->nCol = pSelTab->nCol;
      pTable->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      assert( sqlite3SchemaMutexHeld(db, 0, pTable->pSchema) );
    }else{
      pTable->nCol = 0;
      nErr++;
    }
    sqlite3DeleteTable(db, pSelTab);
    sqlite3SelectDelete(db, pSel);
    db->lookaside.bDisable--;
  } else {
    nErr++;
  }
  pTable->pSchema->schemaFlags |= DB_UnresetViews;
#endif /* SQLITE_OMIT_VIEW */
  return nErr;  
}